

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket_parser.h
# Opt level: O2

uint64_t websocket_server_wrap
                   (void *target,void *msg,uint64_t len,uchar opcode,uchar first,uchar last,
                   uchar rsv)

{
  byte bVar1;
  undefined1 uVar2;
  undefined3 in_register_00000081;
  long lVar3;
  undefined8 uStack_20;
  
  bVar1 = opcode & 0xf;
  if (CONCAT31(in_register_00000081,first) == 0) {
    bVar1 = 0;
  }
  *(byte *)target = last << 7 | bVar1;
  if (len < 0x7e) {
    lVar3 = 2;
    uStack_20 = 1;
  }
  else {
    uVar2 = (undefined1)(len >> 8);
    if (len < 0x10000) {
      *(undefined1 *)((long)target + 1) = 0x7e;
      *(undefined1 *)((long)target + 2) = uVar2;
      lVar3 = 4;
      uStack_20 = 3;
    }
    else {
      *(undefined1 *)((long)target + 1) = 0x7f;
      *(char *)((long)target + 2) = (char)(len >> 0x38);
      *(char *)((long)target + 3) = (char)(len >> 0x30);
      *(char *)((long)target + 4) = (char)(len >> 0x28);
      *(char *)((long)target + 5) = (char)(len >> 0x20);
      *(char *)((long)target + 6) = (char)(len >> 0x18);
      *(char *)((long)target + 7) = (char)(len >> 0x10);
      *(undefined1 *)((long)target + 8) = uVar2;
      lVar3 = 10;
      uStack_20 = 9;
    }
  }
  *(char *)((long)target + uStack_20) = (char)len;
  memcpy((void *)((long)target + lVar3),msg,len);
  return lVar3 + len;
}

Assistant:

static uint64_t websocket_server_wrap(void *target, void *msg, uint64_t len,
                                      unsigned char opcode, unsigned char first,
                                      unsigned char last, unsigned char rsv) {
  ((uint8_t *)target)[0] = 0 |
                           /* opcode */ (((first ? opcode : 0) & 15)) |
                           /* rsv */ ((rsv & 7) << 4) |
                           /*fin*/ ((last & 1) << 7);
  if (len < 126) {
    ((uint8_t *)target)[1] = len;
    memcpy(((uint8_t *)target) + 2, msg, len);
    return len + 2;
  } else if (len < (1UL << 16)) {
    /* head is 4 bytes */
    ((uint8_t *)target)[1] = 126;
    websocket_u2str16(((uint8_t *)target + 2), len);
    memcpy((uint8_t *)target + 4, msg, len);
    return len + 4;
  }
  /* Really Long Message  */
  ((uint8_t *)target)[1] = 127;
  websocket_u2str64(((uint8_t *)target + 2), len);
  memcpy((uint8_t *)target + 10, msg, len);
  return len + 10;
}